

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteImport(WatWriter *this,Import *import)

{
  string_view sVar1;
  ExternalKind EVar2;
  FuncImport *pFVar3;
  TableImport *pTVar4;
  MemoryImport *pMVar5;
  GlobalImport *pGVar6;
  TagImport *pTVar7;
  Import *import_local;
  WatWriter *this_local;
  
  if ((this->options_->inline_import & 1U) == 0) {
    WriteOpenSpace(this,"import");
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&import->module_name)
    ;
    WriteQuotedString(this,sVar1,Space);
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&import->field_name);
    WriteQuotedString(this,sVar1,Space);
  }
  EVar2 = Import::kind(import);
  switch(EVar2) {
  case First:
    pFVar3 = cast<wabt::FuncImport,wabt::Import>(import);
    WriteBeginFunc(this,&pFVar3->func);
    WriteCloseSpace(this);
    break;
  case Table:
    pTVar4 = cast<wabt::TableImport,wabt::Import>(import);
    WriteTable(this,&pTVar4->table);
    break;
  case Memory:
    pMVar5 = cast<wabt::MemoryImport,wabt::Import>(import);
    WriteMemory(this,&pMVar5->memory);
    break;
  case Global:
    pGVar6 = cast<wabt::GlobalImport,wabt::Import>(import);
    WriteBeginGlobal(this,&pGVar6->global);
    WriteCloseSpace(this);
    break;
  case Last:
    pTVar7 = cast<wabt::TagImport,wabt::Import>(import);
    WriteTag(this,&pTVar7->tag);
  }
  if ((this->options_->inline_import & 1U) == 0) {
    WriteCloseNewline(this);
  }
  else {
    WriteNewline(this,false);
  }
  return;
}

Assistant:

void WatWriter::WriteImport(const Import& import) {
  if (!options_.inline_import) {
    WriteOpenSpace("import");
    WriteQuotedString(import.module_name, NextChar::Space);
    WriteQuotedString(import.field_name, NextChar::Space);
  }

  switch (import.kind()) {
    case ExternalKind::Func:
      WriteBeginFunc(cast<FuncImport>(&import)->func);
      WriteCloseSpace();
      break;

    case ExternalKind::Table:
      WriteTable(cast<TableImport>(&import)->table);
      break;

    case ExternalKind::Memory:
      WriteMemory(cast<MemoryImport>(&import)->memory);
      break;

    case ExternalKind::Global:
      WriteBeginGlobal(cast<GlobalImport>(&import)->global);
      WriteCloseSpace();
      break;

    case ExternalKind::Tag:
      WriteTag(cast<TagImport>(&import)->tag);
      break;
  }

  if (options_.inline_import) {
    WriteNewline(NO_FORCE_NEWLINE);
  } else {
    WriteCloseNewline();
  }
}